

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bug-007.cc
# Opt level: O1

int main(int param_1,char **param_2)

{
  ostream *poVar1;
  shared_ptr<tchecker::parsing::system_declaration_t> sVar2;
  shared_ptr<tchecker::parsing::system_declaration_t> sysdecl;
  string model;
  ostream *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  string local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"system:foo\n","");
  sVar2 = tchecker::test::parse((test *)&local_40,&local_30);
  if (local_40 != (ostream *)0x0) {
    poVar1 = tchecker::parsing::operator<<
                       ((parsing *)&std::cout,local_40,
                        (declaration_t *)
                        sVar2.
                        super___shared_ptr<tchecker::parsing::system_declaration_t,_(__gnu_cxx::_Lock_policy)2>
                        ._M_refcount._M_pi._M_pi);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    return 0;
  }
  __assert_fail("sysdecl != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/test/bugfixes/bug-007.cc"
                ,0xd,"int main(int, char **)");
}

Assistant:

int main(int /*argc*/, char ** /*argv*/)
{
  std::string model = "system:foo\n";

  std::shared_ptr<tchecker::parsing::system_declaration_t> sysdecl{tchecker::test::parse(model)};

  assert(sysdecl != nullptr);
  std::cout << *sysdecl << std::endl;

  return 0;
}